

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

size_t ftxui::GlyphNext(string *input,size_t start)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  uint32_t local_34;
  bool eaten;
  ulong uStack_30;
  uint32_t codepoint;
  size_t end;
  size_t sStack_20;
  bool glyph_found;
  size_t start_local;
  string *input_local;
  
  end._7_1_ = 0;
  sStack_20 = start;
  start_local = (size_t)input;
LAB_00118fe4:
  do {
    uVar1 = sStack_20;
    uVar4 = std::__cxx11::string::size();
    if (uVar4 <= uVar1) {
      iVar3 = std::__cxx11::string::size();
LAB_00119086:
      input_local = (string *)(long)iVar3;
      return (size_t)input_local;
    }
    uStack_30 = 0;
    local_34 = 0;
    bVar2 = EatCodePoint((string *)start_local,sStack_20,&stack0xffffffffffffffd0,&local_34);
    if (bVar2) {
      bVar2 = IsControl(local_34);
      if (!bVar2) {
        bVar2 = IsCombining(local_34);
        if (!bVar2) {
          if ((end._7_1_ & 1) != 0) {
            iVar3 = (int)sStack_20;
            goto LAB_00119086;
          }
          end._7_1_ = 1;
          sStack_20 = uStack_30;
          goto LAB_00118fe4;
        }
      }
    }
    sStack_20 = uStack_30;
  } while( true );
}

Assistant:

size_t GlyphNext(const std::string& input, size_t start) {
  bool glyph_found = false;
  while (start < input.size()) {
    size_t end = 0;
    uint32_t codepoint = 0;
    const bool eaten = EatCodePoint(input, start, &end, &codepoint);

    // Ignore invalid, control characters and combining characters.
    if (!eaten || IsControl(codepoint) || IsCombining(codepoint)) {
      start = end;
      continue;
    }

    // We eat the beginning of the next glyph. If we are eating the one
    // requested, return its start position immediately.
    if (glyph_found) {
      return static_cast<int>(start);
    }

    // Otherwise, skip this glyph and iterate:
    glyph_found = true;
    start = end;
  }
  return static_cast<int>(input.size());
}